

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KFLOAT32 ERP,KFLOAT32 Freq,KFLOAT32 PgRF,
          KFLOAT32 PulseWidth,KUINT32 BurstLength,SystemMode M)

{
  SystemMode M_local;
  KUINT32 BurstLength_local;
  KFLOAT32 PulseWidth_local;
  KFLOAT32 PgRF_local;
  KFLOAT32 Freq_local;
  KFLOAT32 ERP_local;
  IFF_ATC_NAVAIDS_FundamentalParameterData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_ATC_NAVAIDS_FundamentalParameterData_004f2ca8;
  this->m_f32ERP = ERP;
  this->m_f32Freq = Freq;
  this->m_f32PgRF = PgRF;
  this->m_f32PulseWidth = PulseWidth;
  this->m_ui32BurstLength = BurstLength;
  this->m_ui8AppMode = (KUINT8)M;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData( KFLOAT32 ERP, KFLOAT32 Freq, KFLOAT32 PgRF, KFLOAT32 PulseWidth,
        KUINT32 BurstLength, SystemMode M ) :
    m_f32ERP( ERP ),
    m_f32Freq( Freq ),
    m_f32PgRF( PgRF ),
    m_f32PulseWidth( PulseWidth ),
    m_ui32BurstLength( BurstLength ),
    m_ui8AppMode( M ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}